

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O2

void Genetic::generate_population(void)

{
  int i;
  int iVar1;
  value_type local_28;
  
  local_28.first = Hillclimbing::run(10000);
  local_28.second = 0.0;
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::push_back(&solutions_abi_cxx11_,&local_28);
  for (iVar1 = 1; iVar1 < population_limit; iVar1 = iVar1 + 1) {
    local_28.first = Utils::random_solution();
    if (max_weight < (local_28.first)->weight) {
      max_weight = (local_28.first)->weight;
    }
    local_28.second = 0.0;
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::push_back
              (&solutions_abi_cxx11_,&local_28);
  }
  max_weight = max_weight + max_weight;
  return;
}

Assistant:

void Genetic::generate_population()
{
	//std::cout << "Generating population\n";
	//The first solution is the best that hillclimbing can get	
	auto solution = Hillclimbing::run();
	//auto solution = Utils::random_solution();

	solutions.push_back(std::pair<Solution*, double>(solution, 0));
	for (int i = 1; i < population_limit; ++i)
	{
		solution = Utils::random_solution();

		if (solution->weight > max_weight)
			max_weight = solution->weight;

		solutions.push_back(std::pair<Solution*, double>(solution, 0));
	}
	//ticket_max = pow(ticket_max, 2); // to much
	max_weight *= 2;
	//std::cout << "Initial solutions calculated\n";
}